

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarimage.hpp
# Opt level: O3

vec2f __thiscall ScalarImage::dfduv(ScalarImage *this,vec2f *uv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float *pfVar3;
  undefined4 in_ECX;
  undefined4 uVar4;
  float fVar5;
  float fVar8;
  vec2f vVar6;
  undefined1 auVar7 [16];
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  uVar1 = this->w;
  uVar2 = this->h;
  fVar5 = (*uv).x;
  fVar9 = (float)(int)uVar1 * fVar5;
  fVar8 = (*uv).y;
  fVar10 = (float)(int)uVar2 * fVar8;
  iVar11 = (int)fVar9;
  iVar12 = (int)fVar10;
  iVar13 = -(uint)(iVar11 + 2 < (int)uVar1);
  iVar14 = -(uint)(iVar12 + 2 < (int)uVar2);
  auVar7._4_4_ = iVar13;
  auVar7._0_4_ = iVar13;
  auVar7._8_4_ = iVar14;
  auVar7._12_4_ = iVar14;
  uVar4 = movmskpd(in_ECX,auVar7);
  vVar6.x = 0.0;
  vVar6.y = 0.0;
  if ((byte)(-(0.0 <= fVar8) & -(0.0 <= fVar5) & (byte)uVar4 & ((byte)uVar4 & 2) >> 1) == 1) {
    pfVar3 = this->pixels;
    iVar13 = (iVar12 + 1) * uVar1;
    fVar9 = fVar9 - (float)iVar11;
    fVar10 = fVar10 - (float)iVar12;
    fVar5 = (pfVar3[iVar13 + iVar11 + 1] - pfVar3[iVar13 + iVar11]) * fVar9 +
            (1.0 - fVar9) * (pfVar3[uVar1 * iVar12 + iVar11 + 1] - pfVar3[uVar1 * iVar12 + iVar11]);
    fVar8 = (pfVar3[iVar13 + iVar11 + 1] - pfVar3[uVar1 * iVar12 + iVar11 + 1]) * fVar10 +
            (1.0 - fVar10) * (pfVar3[iVar13 + iVar11] - pfVar3[uVar1 * iVar12 + iVar11]);
    vVar6.x = fVar5 + fVar5;
    vVar6.y = fVar8 + fVar8;
  }
  return vVar6;
}

Assistant:

vec2f dfduv(const vec2f& uv) {
		int x = int(uv.x*w);
		int y = int(uv.y*h);
		if (uv.x<0 || uv.y<0 || x+2>=w || y+2>=h) return vec2f();
		float xr = uv.x*w-x;
		float yr = uv.y*h-y;
		float dfdx1 = getPixel(x+1,y) - getPixel(x,y);
		float dfdx2 = getPixel(x+1,y+1) - getPixel(x,y+1);
		float dfdy1 = getPixel(x,y+1) - getPixel(x,y);
		float dfdy2 = getPixel(x+1,y+1) - getPixel(x+1,y);
		float dfdu = (xr*dfdx2 + (1-xr)*dfdx1) * 2;
		float dfdv = (yr*dfdy2 + (1-yr)*dfdy1) * 2; // just a random scaling
		return vec2f(dfdu, dfdv);
	}